

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 AddTag(SySet *pSet,char *zTag,int nByte)

{
  byte *pbVar1;
  ushort **ppuVar2;
  bool bVar3;
  byte *local_40;
  SyString sEntry;
  char *zPtr;
  char *zEnd;
  byte *pbStack_18;
  int nByte_local;
  char *zTag_local;
  SySet *pSet_local;
  
  pbVar1 = (byte *)(zTag + nByte);
  pbStack_18 = (byte *)zTag;
  do {
    while( true ) {
      bVar3 = false;
      if (((((pbStack_18 < pbVar1) && (bVar3 = true, *pbStack_18 != 0x3c)) &&
           (bVar3 = true, *pbStack_18 != 0x2f)) &&
          ((bVar3 = true, *pbStack_18 != 0x3f && (bVar3 = true, *pbStack_18 != 0x21)))) &&
         ((bVar3 = true, *pbStack_18 != 0x2d && (bVar3 = false, *pbStack_18 < 0xc0)))) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)(char)*pbStack_18] & 0x2000) != 0;
      }
      if (!bVar3) break;
      pbStack_18 = pbStack_18 + 1;
    }
    if (pbVar1 <= pbStack_18) {
      return 0;
    }
    sEntry._8_8_ = pbStack_18;
    while (pbStack_18 < pbVar1) {
      if (*pbStack_18 < 0xc0) {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(char)*pbStack_18] & 8) == 0) break;
        pbStack_18 = pbStack_18 + 1;
      }
      else {
        do {
          pbStack_18 = pbStack_18 + 1;
          bVar3 = false;
          if (pbStack_18 < pbVar1) {
            bVar3 = (*pbStack_18 & 0xc0) == 0x80;
          }
        } while (bVar3);
      }
    }
    if ((ulong)sEntry._8_8_ < pbStack_18) {
      local_40 = (byte *)sEntry._8_8_;
      sEntry.zString._0_4_ = (int)pbStack_18 - sEntry.nByte;
      while( true ) {
        bVar3 = false;
        if (((int)sEntry.zString != 0) && (bVar3 = false, *local_40 < 0xc0)) {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)(char)*local_40] & 0x2000) != 0;
        }
        if (!bVar3) break;
        sEntry.zString._0_4_ = (int)sEntry.zString + -1;
        local_40 = local_40 + 1;
      }
      while( true ) {
        bVar3 = false;
        if (((int)sEntry.zString != 0) && (bVar3 = false, local_40[(int)sEntry.zString - 1] < 0xc0))
        {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)(char)local_40[(int)sEntry.zString - 1]] & 0x2000) != 0;
        }
        if (!bVar3) break;
        sEntry.zString._0_4_ = (int)sEntry.zString + -1;
      }
      SySetPut(pSet,&local_40);
    }
    pbStack_18 = pbStack_18 + 1;
  } while( true );
}

Assistant:

static sxi32 AddTag(SySet *pSet, const char *zTag, int nByte)
{
	const char *zEnd = &zTag[nByte];
	const char *zPtr;
	SyString sEntry;
	/* Strip tags */
	for(;;){
		while( zTag < zEnd && (zTag[0] == '<' || zTag[0] == '/' || zTag[0] == '?'
			|| zTag[0] == '!' || zTag[0] == '-' || ((unsigned char)zTag[0] < 0xc0 && SyisSpace(zTag[0]))) ){
				zTag++;
		}
		if( zTag >= zEnd ){
			break;
		}
		zPtr = zTag;
		/* Delimit the tag */
		while(zTag < zEnd ){
			if( (unsigned char)zTag[0] >= 0xc0 ){
				/* UTF-8 stream */
				zTag++;
				SX_JMP_UTF8(zTag, zEnd);
			}else if( !SyisAlphaNum(zTag[0]) ){
				break;
			}else{
				zTag++;
			}
		}
		if( zTag > zPtr ){
			/* Perform the insertion */
			SyStringInitFromBuf(&sEntry, zPtr, (int)(zTag-zPtr));
			SyStringFullTrim(&sEntry);
			SySetPut(pSet, (const void *)&sEntry);
		}
		/* Jump the trailing '>' */
		zTag++;
	}
	return SXRET_OK;
}